

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.hpp
# Opt level: O2

void __thiscall libtorrent::dht::put_data_observer::~put_data_observer(put_data_observer *this)

{
  (this->super_traversal_observer).super_observer._vptr_observer =
       (_func_int **)&PTR__put_data_observer_004d31c8;
  ::std::__cxx11::string::~string((string *)&this->m_token);
  observer::~observer((observer *)this);
  return;
}

Assistant:

put_data_observer(
		std::shared_ptr<traversal_algorithm> algorithm
		, udp::endpoint const& ep, node_id const& id, std::string token)
		: traversal_observer(std::move(algorithm), ep, id)
		, m_token(std::move(token))
	{
	}